

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32x32_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int in_ECX;
  int in_EDX;
  undefined8 *in_RDI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  __m128i *rounding_00;
  __m128i *cospim16_00;
  int bit_00;
  undefined8 extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  __m128i *extraout_XMM0_Qb_08;
  longlong extraout_XMM0_Qb_09;
  __m128i *bf1_00;
  __m128i bf1 [32];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rounding;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospim48;
  __m128i cospi48;
  __m128i cospim32;
  __m128i cospi32;
  __m128i cospim24;
  __m128i cospim56;
  __m128i cospim8;
  __m128i cospim40;
  __m128i cospi8;
  __m128i cospi40;
  __m128i cospi24;
  __m128i cospi56;
  __m128i cospim52;
  __m128i cospi4;
  __m128i cospi12;
  __m128i cospi60;
  __m128i cospim50;
  __m128i cospim58;
  __m128i cospi2;
  __m128i cospi10;
  __m128i cospi6;
  __m128i cospi54;
  __m128i cospi14;
  __m128i cospi62;
  int32_t *cospi;
  int iVar1;
  undefined4 in_stack_fffffffffffff7bc;
  undefined4 in_stack_fffffffffffff7c0;
  int iVar2;
  __m128i *palVar3;
  __m128i *palVar4;
  __m128i *in_stack_fffffffffffff7d8;
  __m128i *cospim32_00;
  __m128i *in_stack_fffffffffffff7e0;
  __m128i *bf1_01;
  __m128i *out_00;
  __m128i *in_stack_fffffffffffff7f0;
  __m128i *bf1_02;
  __m128i *in_stack_fffffffffffff7f8;
  int bit_01;
  __m128i *in_stack_fffffffffffff800;
  __m128i *rounding_01;
  int bit_02;
  longlong local_7b8;
  __m128i *clamp_hi_00;
  longlong local_778;
  longlong lStack_770;
  longlong local_768;
  longlong lStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  longlong local_738;
  longlong lStack_730;
  longlong local_728;
  longlong lStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  longlong local_6f8;
  longlong lStack_6f0;
  longlong local_6e8;
  longlong lStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  longlong local_6b8;
  longlong lStack_6b0;
  longlong local_6a8;
  longlong lStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  longlong local_678;
  longlong lStack_670;
  longlong local_668;
  longlong lStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  int local_60c;
  longlong local_608;
  longlong lStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  longlong local_5a8;
  longlong lStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  longlong local_558;
  longlong lStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  longlong local_528;
  longlong lStack_520;
  longlong local_518;
  longlong lStack_510;
  longlong local_508;
  longlong lStack_500;
  longlong local_4f8;
  longlong lStack_4f0;
  longlong local_4e8;
  longlong lStack_4e0;
  longlong local_4d8;
  longlong lStack_4d0;
  longlong local_4c8;
  longlong lStack_4c0;
  longlong local_4b8;
  longlong lStack_4b0;
  longlong local_4a8;
  longlong lStack_4a0;
  longlong local_498;
  longlong lStack_490;
  longlong local_488;
  longlong lStack_480;
  longlong local_478;
  longlong lStack_470;
  longlong local_468;
  longlong lStack_460;
  int32_t *local_458;
  int local_44c;
  int local_448;
  int local_444;
  undefined8 *local_438;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int32_t local_41c;
  int local_418;
  int32_t local_414;
  int local_410;
  int32_t local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int32_t local_3f8;
  int32_t local_3f4;
  int32_t local_3f0;
  int32_t local_3ec;
  int local_3e8;
  int32_t local_3e4;
  int32_t local_3e0;
  int32_t local_3dc;
  int local_3d8;
  int local_3d4;
  int32_t local_3d0;
  int32_t local_3cc;
  int32_t local_3c8;
  int32_t local_3c4;
  int32_t local_3c0;
  int32_t local_3bc;
  longlong local_3b8;
  longlong lStack_3b0;
  int32_t local_3a8;
  int32_t local_3a4;
  int32_t local_3a0;
  int32_t local_39c;
  longlong local_398;
  longlong lStack_390;
  int32_t local_388;
  int32_t local_384;
  int32_t local_380;
  int32_t local_37c;
  longlong local_378;
  longlong lStack_370;
  int32_t local_368;
  int32_t local_364;
  int32_t local_360;
  int32_t local_35c;
  longlong local_358;
  longlong lStack_350;
  int32_t local_348;
  int32_t local_344;
  int32_t local_340;
  int32_t local_33c;
  longlong local_338;
  longlong lStack_330;
  int32_t local_328;
  int32_t local_324;
  int32_t local_320;
  int32_t local_31c;
  longlong local_318;
  longlong lStack_310;
  int32_t local_308;
  int32_t local_304;
  int32_t local_300;
  int32_t local_2fc;
  longlong local_2f8;
  longlong lStack_2f0;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  longlong local_2d8;
  longlong lStack_2d0;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  longlong local_2b8;
  longlong lStack_2b0;
  int32_t local_2a8;
  int32_t local_2a4;
  int32_t local_2a0;
  int32_t local_29c;
  longlong local_298;
  longlong lStack_290;
  int32_t local_288;
  int32_t local_284;
  int32_t local_280;
  int32_t local_27c;
  longlong local_278;
  longlong lStack_270;
  int32_t local_268;
  int32_t local_264;
  int32_t local_260;
  int32_t local_25c;
  longlong local_258;
  longlong lStack_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  longlong local_238;
  longlong lStack_230;
  int32_t local_228;
  int32_t local_224;
  int32_t local_220;
  int32_t local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  int32_t local_208;
  int32_t local_204;
  int32_t local_200;
  int32_t local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  int32_t local_1e8;
  int32_t local_1e4;
  int32_t local_1e0;
  int32_t local_1dc;
  longlong local_1d8;
  longlong lStack_1d0;
  int32_t local_1c8;
  int32_t local_1c4;
  int32_t local_1c0;
  int32_t local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  longlong local_138;
  longlong lStack_130;
  int32_t local_128;
  int32_t local_124;
  int32_t local_120;
  int32_t local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int32_t local_e8;
  int32_t local_e4;
  int32_t local_e0;
  int32_t local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int32_t local_a8;
  int32_t local_a4;
  int32_t local_a0;
  int32_t local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  longlong local_78;
  longlong lStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_44c = in_R8D;
  local_448 = in_ECX;
  local_444 = in_EDX;
  local_438 = in_RDI;
  local_458 = cospi_arr(in_EDX);
  local_3bc = local_458[0x3e];
  local_468 = CONCAT44(local_3bc,local_3bc);
  lStack_460 = CONCAT44(local_3bc,local_3bc);
  local_3c0 = local_458[0xe];
  local_478 = CONCAT44(local_3c0,local_3c0);
  lStack_470 = CONCAT44(local_3c0,local_3c0);
  local_3c4 = local_458[0x36];
  local_488 = CONCAT44(local_3c4,local_3c4);
  lStack_480 = CONCAT44(local_3c4,local_3c4);
  local_3c8 = local_458[6];
  local_498 = CONCAT44(local_3c8,local_3c8);
  lStack_490 = CONCAT44(local_3c8,local_3c8);
  local_3cc = local_458[10];
  local_4a8 = CONCAT44(local_3cc,local_3cc);
  lStack_4a0 = CONCAT44(local_3cc,local_3cc);
  local_3d0 = local_458[2];
  local_4b8 = CONCAT44(local_3d0,local_3d0);
  lStack_4b0 = CONCAT44(local_3d0,local_3d0);
  local_3d4 = -local_458[0x3a];
  local_4c8 = CONCAT44(local_3d4,local_3d4);
  lStack_4c0 = CONCAT44(local_3d4,local_3d4);
  local_3d8 = -local_458[0x32];
  local_4d8 = CONCAT44(local_3d8,local_3d8);
  lStack_4d0 = CONCAT44(local_3d8,local_3d8);
  local_3dc = local_458[0x3c];
  local_4e8 = CONCAT44(local_3dc,local_3dc);
  lStack_4e0 = CONCAT44(local_3dc,local_3dc);
  local_3e0 = local_458[0xc];
  local_4f8 = CONCAT44(local_3e0,local_3e0);
  lStack_4f0 = CONCAT44(local_3e0,local_3e0);
  local_3e4 = local_458[4];
  local_508 = CONCAT44(local_3e4,local_3e4);
  lStack_500 = CONCAT44(local_3e4,local_3e4);
  local_3e8 = -local_458[0x34];
  local_518 = CONCAT44(local_3e8,local_3e8);
  lStack_510 = CONCAT44(local_3e8,local_3e8);
  local_3ec = local_458[0x38];
  local_528 = CONCAT44(local_3ec,local_3ec);
  lStack_520 = CONCAT44(local_3ec,local_3ec);
  local_3f0 = local_458[0x18];
  local_538 = CONCAT44(local_3f0,local_3f0);
  uStack_530 = CONCAT44(local_3f0,local_3f0);
  local_3f4 = local_458[0x28];
  local_548 = CONCAT44(local_3f4,local_3f4);
  uStack_540 = CONCAT44(local_3f4,local_3f4);
  local_3f8 = local_458[8];
  local_558 = CONCAT44(local_3f8,local_3f8);
  lStack_550 = CONCAT44(local_3f8,local_3f8);
  local_3fc = -local_458[0x28];
  local_568 = CONCAT44(local_3fc,local_3fc);
  uStack_560 = CONCAT44(local_3fc,local_3fc);
  local_400 = -local_458[8];
  local_578 = CONCAT44(local_400,local_400);
  uStack_570 = CONCAT44(local_400,local_400);
  local_404 = -local_458[0x38];
  local_588 = CONCAT44(local_404,local_404);
  uStack_580 = CONCAT44(local_404,local_404);
  local_408 = -local_458[0x18];
  local_598 = CONCAT44(local_408,local_408);
  uStack_590 = CONCAT44(local_408,local_408);
  local_40c = local_458[0x20];
  local_5a8 = CONCAT44(local_40c,local_40c);
  lStack_5a0 = CONCAT44(local_40c,local_40c);
  local_410 = -local_458[0x20];
  local_5b8 = CONCAT44(local_410,local_410);
  uStack_5b0 = CONCAT44(local_410,local_410);
  local_414 = local_458[0x30];
  local_5c8 = CONCAT44(local_414,local_414);
  uStack_5c0 = CONCAT44(local_414,local_414);
  local_418 = -local_458[0x30];
  local_5d8 = CONCAT44(local_418,local_418);
  uStack_5d0 = CONCAT44(local_418,local_418);
  local_41c = local_458[0x10];
  local_5e8 = CONCAT44(local_41c,local_41c);
  uStack_5e0 = CONCAT44(local_41c,local_41c);
  local_420 = -local_458[0x10];
  local_5f8 = CONCAT44(local_420,local_420);
  uStack_5f0 = CONCAT44(local_420,local_420);
  local_424 = 1 << ((char)local_444 - 1U & 0x1f);
  local_608 = CONCAT44(local_424,local_424);
  lStack_600 = CONCAT44(local_424,local_424);
  iVar2 = 8;
  if (local_448 != 0) {
    iVar2 = 6;
  }
  if (local_44c + iVar2 < 0x10) {
    iVar2 = 0x10;
  }
  else {
    iVar2 = 8;
    if (local_448 != 0) {
      iVar2 = 6;
    }
    iVar2 = local_44c + iVar2;
  }
  local_60c._0_1_ = (char)iVar2;
  local_428 = -(1 << ((char)local_60c - 1U & 0x1f));
  local_628 = CONCAT44(local_428,local_428);
  uStack_620 = CONCAT44(local_428,local_428);
  local_42c = (1 << ((char)local_60c - 1U & 0x1f)) + -1;
  local_638 = CONCAT44(local_42c,local_42c);
  uStack_630 = CONCAT44(local_42c,local_42c);
  palVar3 = (__m128i *)*local_438;
  palVar4 = (__m128i *)local_438[1];
  local_7b8 = local_438[4];
  local_778 = local_438[0xc];
  lStack_770 = local_438[0xd];
  local_738 = local_438[2];
  lStack_730 = local_438[3];
  local_6f8 = local_438[10];
  lStack_6f0 = local_438[0xb];
  local_6b8 = local_438[6];
  lStack_6b0 = local_438[7];
  local_678 = local_438[0xe];
  lStack_670 = local_438[0xf];
  local_60c = iVar2;
  local_3b8 = local_468;
  lStack_3b0 = lStack_460;
  local_3a8 = local_3bc;
  local_3a4 = local_3bc;
  local_3a0 = local_3bc;
  local_39c = local_3bc;
  local_398 = local_478;
  lStack_390 = lStack_470;
  local_388 = local_3c0;
  local_384 = local_3c0;
  local_380 = local_3c0;
  local_37c = local_3c0;
  local_378 = local_488;
  lStack_370 = lStack_480;
  local_368 = local_3c4;
  local_364 = local_3c4;
  local_360 = local_3c4;
  local_35c = local_3c4;
  local_358 = local_498;
  lStack_350 = lStack_490;
  local_348 = local_3c8;
  local_344 = local_3c8;
  local_340 = local_3c8;
  local_33c = local_3c8;
  local_338 = local_4a8;
  lStack_330 = lStack_4a0;
  local_328 = local_3cc;
  local_324 = local_3cc;
  local_320 = local_3cc;
  local_31c = local_3cc;
  local_318 = local_4b8;
  lStack_310 = lStack_4b0;
  local_308 = local_3d0;
  local_304 = local_3d0;
  local_300 = local_3d0;
  local_2fc = local_3d0;
  local_2f8 = local_4c8;
  lStack_2f0 = lStack_4c0;
  local_2e8 = local_3d4;
  local_2e4 = local_3d4;
  local_2e0 = local_3d4;
  local_2dc = local_3d4;
  local_2d8 = local_4d8;
  lStack_2d0 = lStack_4d0;
  local_2c8 = local_3d8;
  local_2c4 = local_3d8;
  local_2c0 = local_3d8;
  local_2bc = local_3d8;
  local_2b8 = local_4e8;
  lStack_2b0 = lStack_4e0;
  local_2a8 = local_3dc;
  local_2a4 = local_3dc;
  local_2a0 = local_3dc;
  local_29c = local_3dc;
  local_298 = local_4f8;
  lStack_290 = lStack_4f0;
  local_288 = local_3e0;
  local_284 = local_3e0;
  local_280 = local_3e0;
  local_27c = local_3e0;
  local_278 = local_508;
  lStack_270 = lStack_500;
  local_268 = local_3e4;
  local_264 = local_3e4;
  local_260 = local_3e4;
  local_25c = local_3e4;
  local_258 = local_518;
  lStack_250 = lStack_510;
  local_248 = local_3e8;
  local_244 = local_3e8;
  local_240 = local_3e8;
  local_23c = local_3e8;
  local_238 = local_528;
  lStack_230 = lStack_520;
  local_228 = local_3ec;
  local_224 = local_3ec;
  local_220 = local_3ec;
  local_21c = local_3ec;
  local_218 = local_538;
  uStack_210 = uStack_530;
  local_208 = local_3f0;
  local_204 = local_3f0;
  local_200 = local_3f0;
  local_1fc = local_3f0;
  local_1f8 = local_548;
  uStack_1f0 = uStack_540;
  local_1e8 = local_3f4;
  local_1e4 = local_3f4;
  local_1e0 = local_3f4;
  local_1dc = local_3f4;
  local_1d8 = local_558;
  lStack_1d0 = lStack_550;
  local_1c8 = local_3f8;
  local_1c4 = local_3f8;
  local_1c0 = local_3f8;
  local_1bc = local_3f8;
  local_1b8 = local_568;
  uStack_1b0 = uStack_560;
  local_1a8 = local_3fc;
  local_1a4 = local_3fc;
  local_1a0 = local_3fc;
  local_19c = local_3fc;
  local_198 = local_578;
  uStack_190 = uStack_570;
  local_188 = local_400;
  local_184 = local_400;
  local_180 = local_400;
  local_17c = local_400;
  local_178 = local_588;
  uStack_170 = uStack_580;
  local_168 = local_404;
  local_164 = local_404;
  local_160 = local_404;
  local_15c = local_404;
  local_158 = local_598;
  uStack_150 = uStack_590;
  local_148 = local_408;
  local_144 = local_408;
  local_140 = local_408;
  local_13c = local_408;
  local_138 = local_5a8;
  lStack_130 = lStack_5a0;
  local_128 = local_40c;
  local_124 = local_40c;
  local_120 = local_40c;
  local_11c = local_40c;
  local_118 = local_5b8;
  uStack_110 = uStack_5b0;
  local_108 = local_410;
  local_104 = local_410;
  local_100 = local_410;
  local_fc = local_410;
  local_f8 = local_5c8;
  uStack_f0 = uStack_5c0;
  local_e8 = local_414;
  local_e4 = local_414;
  local_e0 = local_414;
  local_dc = local_414;
  local_d8 = local_5d8;
  uStack_d0 = uStack_5d0;
  local_c8 = local_418;
  local_c4 = local_418;
  local_c0 = local_418;
  local_bc = local_418;
  local_b8 = local_5e8;
  uStack_b0 = uStack_5e0;
  local_a8 = local_41c;
  local_a4 = local_41c;
  local_a0 = local_41c;
  local_9c = local_41c;
  local_98 = local_5f8;
  uStack_90 = uStack_5f0;
  local_88 = local_420;
  local_84 = local_420;
  local_80 = local_420;
  local_7c = local_420;
  local_78 = local_608;
  lStack_70 = lStack_600;
  local_68 = local_424;
  local_64 = local_424;
  local_60 = local_424;
  local_5c = local_424;
  local_58 = local_628;
  uStack_50 = uStack_620;
  local_48 = local_428;
  local_44 = local_428;
  local_40 = local_428;
  local_3c = local_428;
  local_38 = local_638;
  uStack_30 = uStack_630;
  local_20 = local_42c;
  local_1c = local_42c;
  local_18 = local_42c;
  local_14 = local_42c;
  half_btf_0_sse4_1((__m128i *)&local_4b8,(__m128i *)&local_738,(__m128i *)&local_608,local_444);
  local_648 = extraout_XMM0_Qa;
  uStack_640 = extraout_XMM0_Qb;
  half_btf_0_sse4_1((__m128i *)&local_468,(__m128i *)&local_738,(__m128i *)&local_608,local_444);
  local_738 = extraout_XMM0_Qa_00;
  lStack_730 = extraout_XMM0_Qb_00;
  half_btf_0_sse4_1((__m128i *)&local_4d8,(__m128i *)&local_678,(__m128i *)&local_608,local_444);
  local_708 = extraout_XMM0_Qa_01;
  uStack_700 = extraout_XMM0_Qb_01;
  half_btf_0_sse4_1((__m128i *)&local_478,(__m128i *)&local_678,(__m128i *)&local_608,local_444);
  local_678 = extraout_XMM0_Qa_02;
  lStack_670 = extraout_XMM0_Qb_02;
  half_btf_0_sse4_1((__m128i *)&local_4a8,(__m128i *)&local_6f8,(__m128i *)&local_608,local_444);
  local_688 = extraout_XMM0_Qa_03;
  uStack_680 = extraout_XMM0_Qb_03;
  half_btf_0_sse4_1((__m128i *)&local_488,(__m128i *)&local_6f8,(__m128i *)&local_608,local_444);
  local_6f8 = extraout_XMM0_Qa_04;
  lStack_6f0 = extraout_XMM0_Qb_04;
  half_btf_0_sse4_1((__m128i *)&local_4c8,(__m128i *)&local_6b8,(__m128i *)&local_608,local_444);
  local_6c8 = extraout_XMM0_Qa_05;
  uStack_6c0 = extraout_XMM0_Qb_05;
  half_btf_0_sse4_1((__m128i *)&local_498,(__m128i *)&local_6b8,(__m128i *)&local_608,local_444);
  local_6b8 = extraout_XMM0_Qa_06;
  lStack_6b0 = extraout_XMM0_Qb_06;
  half_btf_0_sse4_1((__m128i *)&local_508,(__m128i *)&local_7b8,(__m128i *)&local_608,local_444);
  local_748 = extraout_XMM0_Qa_07;
  uStack_740 = extraout_XMM0_Qb_07;
  half_btf_0_sse4_1((__m128i *)&local_4e8,(__m128i *)&local_7b8,(__m128i *)&local_608,local_444);
  clamp_hi_00 = extraout_XMM0_Qb_08;
  half_btf_0_sse4_1((__m128i *)&local_518,(__m128i *)&local_778,(__m128i *)&local_608,local_444);
  half_btf_0_sse4_1((__m128i *)&local_4f8,(__m128i *)&local_778,(__m128i *)&local_608,local_444);
  local_728 = local_738;
  lStack_720 = lStack_730;
  local_718 = local_708;
  uStack_710 = uStack_700;
  local_6e8 = local_6f8;
  lStack_6e0 = lStack_6f0;
  local_6d8 = local_6c8;
  uStack_6d0 = uStack_6c0;
  local_6a8 = local_6b8;
  lStack_6a0 = lStack_6b0;
  local_698 = local_688;
  uStack_690 = uStack_680;
  local_668 = local_678;
  lStack_660 = lStack_670;
  local_658 = local_648;
  uStack_650 = uStack_640;
  local_778 = extraout_XMM0_Qa_08;
  lStack_770 = extraout_XMM0_Qb_09;
  half_btf_0_sse4_1((__m128i *)&local_558,(__m128i *)&stack0xfffffffffffff808,(__m128i *)&local_608,
                    local_444);
  half_btf_0_sse4_1((__m128i *)&local_528,(__m128i *)&stack0xfffffffffffff808,(__m128i *)&local_608,
                    local_444);
  local_768 = local_778;
  lStack_760 = lStack_770;
  local_758 = local_748;
  uStack_750 = uStack_740;
  iVar1 = local_444;
  rounding_01 = rounding_00;
  bit_02 = bit_00;
  idct32_stage4_sse4_1
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,palVar4,palVar3,
             (__m128i *)CONCAT44(iVar2,in_stack_fffffffffffff7c0),
             (__m128i *)CONCAT44(in_stack_fffffffffffff7bc,local_444),in_stack_fffffffffffff7f0,
             in_stack_fffffffffffff7f8,in_stack_fffffffffffff800,rounding_00,bit_00);
  bit_01 = (int)in_stack_fffffffffffff800;
  half_btf_0_sse4_1((__m128i *)&local_5a8,(__m128i *)&stack0xfffffffffffff7c8,(__m128i *)&local_608,
                    local_444);
  palVar3 = cospim16_00;
  palVar4 = bf1_00;
  cospim32_00 = cospim16_00;
  bf1_01 = bf1_00;
  idct32_stage5_sse4_1
            (bf1_00,cospim16_00,bf1_00,cospim16_00,
             (__m128i *)CONCAT44(iVar2,in_stack_fffffffffffff7c0),
             (__m128i *)CONCAT44(in_stack_fffffffffffff7bc,iVar1),in_stack_fffffffffffff7f0,
             in_stack_fffffffffffff7f8,bit_01);
  iVar1 = local_444;
  out_00 = cospim32_00;
  bf1_02 = bf1_01;
  idct32_stage6_sse4_1
            (bf1_01,cospim32_00,palVar4,palVar3,(__m128i *)CONCAT44(iVar2,in_stack_fffffffffffff7c0)
             ,(__m128i *)CONCAT44(in_stack_fffffffffffff7bc,local_444),bf1_01,palVar3,palVar4,
             rounding_01,bit_02);
  idct32_stage7_sse4_1
            (bf1_01,cospim32_00,palVar4,palVar3,(__m128i *)CONCAT44(iVar2,in_stack_fffffffffffff7c0)
             ,(__m128i *)CONCAT44(in_stack_fffffffffffff7bc,iVar1),(int)bf1_02);
  idct32_stage8_sse4_1
            (bf1_01,cospim32_00,palVar4,palVar3,(__m128i *)CONCAT44(iVar2,in_stack_fffffffffffff7c0)
             ,(__m128i *)CONCAT44(in_stack_fffffffffffff7bc,iVar1),(int)bf1_02);
  idct32_stage9_sse4_1
            (bf1_02,out_00,(int)((ulong)bf1_01 >> 0x20),(int)bf1_01,
             (int)((ulong)cospim32_00 >> 0x20),palVar4,clamp_hi_00);
  return;
}

Assistant:

static void idct32x32_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1
  bf1[0] = in[0];
  bf1[4] = in[4];
  bf1[8] = in[2];
  bf1[12] = in[6];
  bf1[16] = in[1];
  bf1[20] = in[5];
  bf1[24] = in[3];
  bf1[28] = in[7];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);

  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);
  bf1[17] = bf1[16];
  bf1[18] = bf1[19];
  bf1[21] = bf1[20];
  bf1[22] = bf1[23];
  bf1[25] = bf1[24];
  bf1[26] = bf1[27];
  bf1[29] = bf1[28];
  bf1[30] = bf1[31];

  // stage 4 :
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);

  bf1[9] = bf1[8];
  bf1[10] = bf1[11];
  bf1[13] = bf1[12];
  bf1[14] = bf1[15];

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[5] = bf1[4];
  bf1[6] = bf1[7];

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  bf1[3] = bf1[0];
  bf1[2] = bf1[1];

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}